

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O0

BlockMemoryPool * __thiscall
cppnet::AlloterWrap::PoolNew<cppnet::BlockMemoryPool,unsigned_short_const&,unsigned_short_const&>
          (AlloterWrap *this,unsigned_short *args,unsigned_short *args_1)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  BlockMemoryPool *res;
  void *data;
  uint32_t sz;
  unsigned_short *args_local_1;
  unsigned_short *args_local;
  AlloterWrap *this_local;
  
  peVar2 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar1 = (*peVar2->_vptr_Alloter[3])(peVar2,0x28);
  this_local = (AlloterWrap *)CONCAT44(extraout_var,iVar1);
  if ((BlockMemoryPool *)this_local == (BlockMemoryPool *)0x0) {
    this_local = (AlloterWrap *)0x0;
  }
  else {
    BlockMemoryPool::BlockMemoryPool((BlockMemoryPool *)this_local,(uint)*args,(uint)*args_1);
  }
  return (BlockMemoryPool *)this_local;
}

Assistant:

T* AlloterWrap::PoolNew(Args&&... args) {
    uint32_t sz = sizeof(T);
    
    void* data = _alloter->MallocAlign(sz);
    if (!data) {
        return nullptr;
    }

    T* res = new(data) T(std::forward<Args>(args)...);
    return res;
}